

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O2

void config_array_destroy(config_array *array)

{
  config_value *value;
  size_t i;
  ulong uVar1;
  
  for (uVar1 = 0; uVar1 < array->length; uVar1 = uVar1 + 1) {
    value = array->values[uVar1];
    if (value != (config_value *)0x0) {
      config_value_destroy(value);
    }
  }
  free(array->values);
  free(array);
  return;
}

Assistant:

void config_array_destroy(struct config_array *array)
{
        for (size_t i = 0; i < array->length; ++i) {
                struct config_value *value_to_destroy = array->values[i];

                if (value_to_destroy != NULL) {
                        config_value_destroy(value_to_destroy);
                }
        }

        free(array->values);
        free(array);
}